

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::segment::Atlas::growCharts(Atlas *this,float threshold)

{
  Chart *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  Chart **ppCVar4;
  int *piVar5;
  uint *value;
  Chart *chart;
  float cost;
  uint32_t face;
  Chart *chart_1;
  float local_20;
  uint32_t i;
  float lowestCost;
  uint32_t bestChart;
  uint32_t bestFace;
  float threshold_local;
  Atlas *this_local;
  
  do {
    if (this->m_facesLeft == 0) {
      return;
    }
    lowestCost = -NAN;
    i = 0xffffffff;
    local_20 = 3.4028235e+38;
    for (chart_1._4_4_ = 0; uVar3 = Array<xatlas::internal::segment::Chart_*>::size(&this->m_charts)
        , chart_1._4_4_ < uVar3; chart_1._4_4_ = chart_1._4_4_ + 1) {
      ppCVar4 = Array<xatlas::internal::segment::Chart_*>::operator[](&this->m_charts,chart_1._4_4_)
      ;
      pCVar1 = *ppCVar4;
      chart._0_4_ = 3.4028235e+38;
      while( true ) {
        chart._4_4_ = -NAN;
        uVar3 = CostQueue::count(&pCVar1->candidates);
        if (uVar3 == 0) break;
        chart._0_4_ = CostQueue::peekCost(&pCVar1->candidates);
        chart._4_4_ = (float)CostQueue::peekFace(&pCVar1->candidates);
        piVar5 = Array<int>::operator[](&this->m_faceCharts,(uint32_t)chart._4_4_);
        if (*piVar5 == -1) break;
        CostQueue::pop(&pCVar1->candidates);
      }
      if ((chart._4_4_ != -NAN) && (chart._0_4_ < local_20)) {
        local_20 = chart._0_4_;
        lowestCost = chart._4_4_;
        i = chart_1._4_4_;
      }
    }
    if (lowestCost == -NAN) {
      return;
    }
    if (threshold < local_20) {
      return;
    }
    ppCVar4 = Array<xatlas::internal::segment::Chart_*>::operator[](&this->m_charts,i);
    pCVar1 = *ppCVar4;
    CostQueue::pop(&pCVar1->candidates);
    bVar2 = addFaceToChart(this,pCVar1,(uint32_t)lowestCost);
    if (!bVar2) {
      value = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,(uint32_t)lowestCost);
      Array<unsigned_int>::push_back(&pCVar1->failedPlanarRegions,value);
    }
  } while( true );
}

Assistant:

void growCharts(float threshold)
	{
		XA_PROFILE_START(buildAtlasGrowCharts)
		for (;;) {
			if (m_facesLeft == 0)
				break;
			// Get the single best candidate out of the chart best candidates.
			uint32_t bestFace = UINT32_MAX, bestChart = UINT32_MAX;
			float lowestCost = FLT_MAX;
			for (uint32_t i = 0; i < m_charts.size(); i++) {
				Chart *chart = m_charts[i];
				// Get the best candidate from the chart.
				// Cleanup any best candidates that have been claimed by another chart.
				uint32_t face = UINT32_MAX;
				float cost = FLT_MAX;
				for (;;) {
					if (chart->candidates.count() == 0)
						break;
					cost = chart->candidates.peekCost();
					face = chart->candidates.peekFace();
					if (m_faceCharts[face] == -1)
						break;
					else {
						// Face belongs to another chart. Pop from queue so the next best candidate can be retrieved.
						chart->candidates.pop();
						face = UINT32_MAX;
					}
				}
				if (face == UINT32_MAX)
					continue; // No candidates for this chart.
				// See if best candidate overall.
				if (cost < lowestCost) {
					lowestCost = cost;
					bestFace = face;
					bestChart = i;
				}
			}
			if (bestFace == UINT32_MAX || lowestCost > threshold)
				break;
			Chart *chart = m_charts[bestChart];
			chart->candidates.pop(); // Pop the selected candidate from the queue.
			if (!addFaceToChart(chart, bestFace))
				chart->failedPlanarRegions.push_back(m_facePlanarRegionId[bestFace]);
		}
		XA_PROFILE_END(buildAtlasGrowCharts)
	}